

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm2_sign.c
# Opt level: O0

int SM2_sign_ex(uint8_t *sig,int *siglen,uint8_t *msg,int msglen,uint8_t *id,int idlen,uint8_t *rand
               ,uint8_t *pubkey_x,uint8_t *pubkey_y,uint8_t *privkey,SM2_SIG_MODE mode,
               SM2_CTX *sm2_ctx)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  long in_stack_00000010;
  SM3_CTX sm3_ctx;
  uint8_t entl_str [2];
  uint8_t e [32];
  uint8_t ZA [32];
  int ret;
  undefined8 in_stack_ffffffffffffff08;
  uint data_len;
  uint8_t *in_stack_ffffffffffffff10;
  SM3_CTX *in_stack_ffffffffffffff18;
  uint8_t *in_stack_ffffffffffffff20;
  SM3_CTX *in_stack_ffffffffffffff28;
  SM2_SIG_MODE in_stack_ffffffffffffffac;
  uint8_t *in_stack_ffffffffffffffb0;
  uint8_t *in_stack_ffffffffffffffb8;
  uint8_t *in_stack_ffffffffffffffc0;
  int *in_stack_ffffffffffffffc8;
  int iVar2;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar2 = 0;
  if ((((((in_RDX != 0) && (-1 < in_ECX)) && (in_R8 != 0)) && ((-1 < in_R9D && (in_R9D < 0x10000))))
      && ((in_RDI != 0 && ((in_RSI != 0 && (in_stack_00000010 != 0)))))) &&
     ((sm3_ctx.digest._4_8_ != 0 && ((sm3_ctx.digest._12_8_ != 0 && (sm3_ctx._28_8_ != 0)))))) {
    SM3_init((SM3_CTX *)&stack0xffffffffffffff1c);
    data_len = (uint)((ulong)in_stack_ffffffffffffff08 >> 0x20);
    SM3_update(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,data_len);
    SM3_update(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,data_len);
    SM3_update(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,data_len);
    SM3_update(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,data_len);
    SM3_update(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,data_len);
    SM3_final(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    SM3_init((SM3_CTX *)&stack0xffffffffffffff1c);
    SM3_update(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,data_len);
    SM3_update(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,data_len);
    SM3_final(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    iVar1 = SM2_sign((uint8_t *)CONCAT44(in_R9D,iVar2),in_stack_ffffffffffffffc8,
                     in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                     in_stack_ffffffffffffffac,(SM2_CTX *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0)
                    );
    if (iVar1 != 0) {
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int SM2_sign_ex(uint8_t *sig, int *siglen,  
                const uint8_t *msg, int msglen, 
                const uint8_t *id, int idlen,
                const uint8_t rand[32], 
                const uint8_t pubkey_x[32], const uint8_t pubkey_y[32], const uint8_t privkey[32],
                SM2_SIG_MODE mode, SM2_CTX *sm2_ctx)
{
    int ret = GML_ERROR;
    uint8_t ZA[32];
    uint8_t e[32];
    uint8_t entl_str[2];
    SM3_CTX sm3_ctx;

    if (msg == NULL || msglen < 0 || id == NULL || idlen < 0 || idlen >= 65536 || sig == NULL || siglen == NULL || 
        pubkey_x == NULL || pubkey_y == NULL || privkey == NULL || sm2_ctx == NULL)
        goto end;

    entl_str[0] = (uint8_t)((idlen << 3) >> 8);
    entl_str[1] = (uint8_t)((idlen << 3) & 0xff);
    /* ZA = SM3 (ENTLA || IDA || a || b || Gx || Gy || Ax || Ay) */
    SM3_init(&sm3_ctx);
    SM3_update(&sm3_ctx, entl_str, 2);
    SM3_update(&sm3_ctx, id, idlen);
    SM3_update(&sm3_ctx, a_b_gx_gy, 128);
    SM3_update(&sm3_ctx, pubkey_x, 32);
    SM3_update(&sm3_ctx, pubkey_y, 32);
    SM3_final(&sm3_ctx, ZA);

    /* e = SM3(ZA || m) */
    SM3_init(&sm3_ctx);
    SM3_update(&sm3_ctx, ZA, 32);
    SM3_update(&sm3_ctx, msg, msglen);
    SM3_final(&sm3_ctx, e);

    if (SM2_sign(sig, siglen, e, rand, privkey, mode, sm2_ctx) == GML_ERROR)
        goto end;

    ret = GML_OK;
end:
    return ret;
}